

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::FillRuleCase::iterate(FillRuleCase *this)

{
  size_type *psVar1;
  uint uVar2;
  TestLog *pTVar3;
  int i;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  pointer pVVar9;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong *puVar11;
  long lVar12;
  Surface *pSVar13;
  void *__buf;
  void *__buf_00;
  char *description;
  int row;
  int iVar14;
  ulong uVar15;
  int iVar16;
  IterateResult IVar17;
  undefined8 uVar18;
  bool bVar19;
  ulong uVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Vec2 sideH;
  Vec2 sideV;
  Vec2 center;
  Vector<float,_2> res_4;
  Vector<float,_2> res_3;
  Random rnd;
  Vector<float,_2> res_1;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  Vector<float,_2> res_5;
  Vec2 quad [4];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_318;
  string local_2f8;
  string local_2d8;
  undefined1 local_2b8 [8];
  size_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  float local_294;
  float local_290 [5];
  int local_27c;
  int local_278;
  int local_274;
  LogImageSet local_270;
  ulong local_230;
  string local_228;
  Surface local_208;
  float local_1ec;
  string local_1e8;
  ScopedLogSection local_1c8;
  float local_1c0 [2];
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_148 [8];
  ios_base local_140 [264];
  long local_38;
  
  iVar4 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar4 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1c06ce9);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar10) {
    local_2a8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2a8._8_8_ = plVar5[3];
    local_2b8 = (undefined1  [8])&local_2a8;
  }
  else {
    local_2a8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2b8 = (undefined1  [8])*plVar5;
  }
  local_2b0 = plVar5[1];
  *plVar5 = (long)paVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_2b8);
  paVar10 = &local_270.m_name.field_2;
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_270.m_name.field_2._M_allocated_capacity = *puVar11;
    local_270.m_name.field_2._8_8_ = plVar5[3];
    local_270.m_name._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_270.m_name.field_2._M_allocated_capacity = *puVar11;
    local_270.m_name._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_270.m_name._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_name._M_dataplus._M_p != paVar10) {
    uVar18 = local_270.m_name.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_270.m_name._M_string_length + local_2d8._M_string_length) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      uVar18 = local_2d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_270.m_name._M_string_length + local_2d8._M_string_length)
    goto LAB_0108011f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2d8,0,(char *)0x0,(ulong)local_270.m_name._M_dataplus._M_p);
  }
  else {
LAB_0108011f:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_2d8._M_dataplus._M_p);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1e8.field_2._M_allocated_capacity = *psVar1;
    local_1e8.field_2._8_8_ = puVar6[3];
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar1;
    local_1e8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_1e8._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_name._M_dataplus._M_p != paVar10) {
    operator_delete(local_270.m_name._M_dataplus._M_p,
                    local_270.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1c8,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_1e8,&local_1e8);
  iVar14 = 1 << (8U - (char)(this->super_BaseRenderingCase).m_pixelFormat.redBits & 0x1f);
  iVar16 = 1 << (8U - (char)(this->super_BaseRenderingCase).m_pixelFormat.greenBits & 0x1f);
  local_274 = 1 << (8U - (char)(this->super_BaseRenderingCase).m_pixelFormat.blueBits & 0x1f);
  iVar4 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_208,iVar4,iVar4);
  local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = *(uint *)&(this->super_BaseRenderingCase).field_0xc4;
  local_27c = iVar14;
  local_278 = iVar16;
  if (uVar2 < 5) {
    local_230 = (ulong)(uint)this->m_iteration;
    if ((0x13U >> (uVar2 & 0x1f) & 1) == 0) {
      local_270.m_name._M_dataplus._M_p._4_4_ = 0x3f000000;
      if (uVar2 != 3) {
        local_270.m_name._M_dataplus._M_p._4_4_ = 0;
      }
      fVar22 = *(float *)(&DAT_01c06614 + (ulong)(uVar2 == 3) * 4);
      local_270.m_name._M_dataplus._M_p._0_4_ = local_270.m_name._M_dataplus._M_p._4_4_;
      local_294 = ((float)this->m_iteration / (float)(this->m_iterationCount + -1)) * 3.1415927 *
                  0.5;
      fVar23 = cosf(local_294);
      local_1b8._4_4_ = sinf(local_294);
      local_1b8._0_4_ = fVar23;
      local_2b8 = (undefined1  [8])0x0;
      lVar12 = 0;
      do {
        *(float *)(local_2b8 + lVar12 * 4) = *(float *)(local_1b8 + lVar12 * 4) * fVar22;
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_2f8._M_dataplus._M_p =
           (pointer)(CONCAT44(local_2b8._0_4_,local_2b8._4_4_) ^ 0x8000000000000000);
      local_2d8._M_dataplus._M_p = (pointer)0x0;
      lVar12 = 0;
      do {
        *(float *)((long)&local_2d8._M_dataplus._M_p + lVar12 * 4) =
             *(float *)((long)&local_270.m_name._M_dataplus._M_p + lVar12 * 4) +
             *(float *)(local_2b8 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_1b8 = (undefined1  [8])0x0;
      lVar12 = 0;
      do {
        *(float *)(local_1b8 + lVar12 * 4) =
             *(float *)((long)&local_2d8._M_dataplus._M_p + lVar12 * 4) +
             *(float *)((long)&local_2f8._M_dataplus._M_p + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_228._M_dataplus._M_p = (pointer)0x0;
      lVar12 = 0;
      do {
        *(float *)((long)&local_228._M_dataplus._M_p + lVar12 * 4) =
             *(float *)((long)&local_270.m_name._M_dataplus._M_p + lVar12 * 4) +
             *(float *)(local_2b8 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      uStack_1b0 = (_func_int **)0x0;
      lVar12 = 0;
      do {
        *(float *)((long)&uStack_1b0 + lVar12 * 4) =
             *(float *)((long)&local_228._M_dataplus._M_p + lVar12 * 4) -
             *(float *)((long)&local_2f8._M_dataplus._M_p + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_290[2] = 0.0;
      local_290[3] = 0.0;
      lVar12 = 0;
      do {
        local_290[lVar12 + 2] =
             *(float *)((long)&local_270.m_name._M_dataplus._M_p + lVar12 * 4) -
             *(float *)(local_2b8 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_1a8._0_8_ = 0;
      lVar12 = 0;
      do {
        *(float *)(local_1a8 + lVar12 * 4) =
             local_290[lVar12 + 2] - *(float *)((long)&local_2f8._M_dataplus._M_p + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_290[0] = 0.0;
      local_290[1] = 0.0;
      lVar12 = 0;
      do {
        local_290[lVar12] =
             *(float *)((long)&local_270.m_name._M_dataplus._M_p + lVar12 * 4) -
             *(float *)(local_2b8 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_1a8._8_8_ = 0;
      lVar12 = 0;
      do {
        *(float *)(local_1a8 + lVar12 * 4 + 8) =
             local_290[lVar12] + *(float *)((long)&local_2f8._M_dataplus._M_p + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_318,6);
      (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[0] = (float)local_1b8._0_4_;
      (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[1] = (float)local_1b8._4_4_;
      (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
      (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
      *(_func_int ***)
       local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start[1].m_data = uStack_1b0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = (float)local_1a8._0_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = (float)local_1a8._4_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = (float)local_1a8._0_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = (float)local_1a8._4_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = (float)local_1b8._0_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = (float)local_1b8._4_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
      *(undefined8 *)
       local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start[5].m_data = local_1a8._8_8_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
    }
    else {
      deRandom_init((deRandom *)&local_270,0xabcd);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_318,0x60);
      local_230 = (ulong)(uint)((int)local_230 << 4);
      lVar12 = 0;
      do {
        fVar22 = ((float)(int)lVar12 + 0.5) * 0.25;
        local_294 = fVar22 + fVar22 + -1.0;
        uVar20 = lVar12 * 4;
        iVar4 = (int)local_230;
        uVar15 = 0;
        local_38 = lVar12;
        do {
          fVar22 = ((float)(int)uVar15 + 0.5) * 0.25;
          local_2b8._4_4_ = local_294;
          local_2b8._0_4_ = fVar22 + fVar22 + -1.0;
          fVar22 = ((float)(iVar4 + (int)lVar12 * 4 + (int)uVar15) /
                   (float)(this->m_iterationCount << 4)) * 3.1415927 * 0.5;
          fVar23 = cosf(fVar22);
          local_1b8._4_4_ = sinf(fVar22);
          local_1b8._0_4_ = fVar23;
          local_2f8._M_dataplus._M_p = (pointer)0x0;
          lVar7 = 0;
          do {
            *(float *)((long)&local_2f8._M_dataplus._M_p + lVar7 * 4) =
                 *(float *)(local_1b8 + lVar7 * 4) * 0.15;
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_2d8._M_dataplus._M_p =
               (pointer)(CONCAT44(local_2f8._M_dataplus._M_p._0_4_,local_2f8._M_dataplus._M_p._4_4_)
                        ^ 0x8000000000000000);
          local_228._M_dataplus._M_p = (pointer)0x0;
          lVar7 = 0;
          do {
            *(float *)((long)&local_228._M_dataplus._M_p + lVar7 * 4) =
                 *(float *)(local_2b8 + lVar7 * 4) +
                 *(float *)((long)&local_2f8._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_1b8 = (undefined1  [8])0x0;
          lVar7 = 0;
          do {
            *(float *)(local_1b8 + lVar7 * 4) =
                 *(float *)((long)&local_228._M_dataplus._M_p + lVar7 * 4) +
                 *(float *)((long)&local_2d8._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_290[2] = 0.0;
          local_290[3] = 0.0;
          lVar7 = 0;
          do {
            local_290[lVar7 + 2] =
                 *(float *)(local_2b8 + lVar7 * 4) +
                 *(float *)((long)&local_2f8._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          uStack_1b0 = (_func_int **)0x0;
          lVar7 = 0;
          do {
            *(float *)((long)&uStack_1b0 + lVar7 * 4) =
                 local_290[lVar7 + 2] - *(float *)((long)&local_2d8._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_290[0] = 0.0;
          local_290[1] = 0.0;
          lVar7 = 0;
          do {
            local_290[lVar7] =
                 *(float *)(local_2b8 + lVar7 * 4) -
                 *(float *)((long)&local_2f8._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_1a8._0_8_ = 0;
          lVar7 = 0;
          do {
            *(float *)(local_1a8 + lVar7 * 4) =
                 local_290[lVar7] - *(float *)((long)&local_2d8._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_1c0[0] = 0.0;
          local_1c0[1] = 0.0;
          lVar7 = 0;
          do {
            local_1c0[lVar7] =
                 *(float *)(local_2b8 + lVar7 * 4) -
                 *(float *)((long)&local_2f8._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_1a8._8_8_ = 0;
          lVar7 = 0;
          do {
            *(float *)(local_1a8 + lVar7 * 4 + 8) =
                 local_1c0[lVar7] + *(float *)((long)&local_2d8._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          iVar14 = *(int *)&(this->super_BaseRenderingCase).field_0xc4;
          if (iVar14 == 4) {
            fVar22 = deRandom_getFloat((deRandom *)&local_270);
            fVar22 = fVar22 * 3.9 + 0.1;
            fVar23 = deRandom_getFloat((deRandom *)&local_270);
            local_1ec = fVar23 * 3.9 + 0.1;
            fVar23 = deRandom_getFloat((deRandom *)&local_270);
            fVar24 = deRandom_getFloat((deRandom *)&local_270);
            fVar23 = fVar23 * 3.9 + 0.1;
            fVar24 = fVar24 * 3.9 + 0.1;
            uVar8 = uVar15 | uVar20;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[0] =
                 (float)local_1b8._0_4_ * fVar22;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[1] =
                 (float)local_1b8._4_4_ * fVar22;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[3] = fVar22;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[0] =
                 (float)uStack_1b0 * local_1ec;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[1] =
                 uStack_1b0._4_4_ * local_1ec;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[3] = local_1ec;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[0] =
                 (float)local_1a8._0_4_ * fVar23;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[1] =
                 (float)local_1a8._4_4_ * fVar23;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[3] = fVar23;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[0] =
                 (float)local_1a8._0_4_ * fVar23;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[1] =
                 (float)local_1a8._4_4_ * fVar23;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[3] = fVar23;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[0] =
                 (float)local_1b8._0_4_ * fVar22;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[1] =
                 (float)local_1b8._4_4_ * fVar22;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[3] = fVar22;
            fVar22 = (float)local_1a8._8_4_ * fVar24;
            fVar23 = (float)local_1a8._12_4_ * fVar24;
            pVVar9 = local_318.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar8 * 6;
LAB_010808bc:
            pVVar9[5].m_data[0] = fVar22;
            pVVar9[5].m_data[1] = fVar23;
            pVVar9[5].m_data[2] = 0.0;
            pVVar9[5].m_data[3] = fVar24;
          }
          else {
            if (iVar14 == 1) {
              uVar8 = uVar15 | uVar20;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[0] = (float)local_1b8._0_4_
              ;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[1] = (float)local_1b8._4_4_
              ;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[3] = 1.0;
              *(_func_int ***)
               local_318.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data = uStack_1b0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[0] =
                   (float)local_1a8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[1] =
                   (float)local_1a8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[0] =
                   (float)local_1b8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[1] =
                   (float)local_1b8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[0] =
                   (float)local_1a8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[1] =
                   (float)local_1a8._4_4_;
LAB_01080706:
              (local_318.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + 4)[(uVar15 | uVar20) * 6].m_data[2] = 0.0;
              (local_318.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + 4)[(uVar15 | uVar20) * 6].m_data[3] = 1.0;
              pVVar9 = local_318.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (uVar15 | uVar20) * 6;
              fVar24 = 1.0;
              fVar22 = (float)local_1a8._8_4_;
              fVar23 = (float)local_1a8._12_4_;
              goto LAB_010808bc;
            }
            if (iVar14 == 0) {
              uVar8 = uVar15 | uVar20;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[0] = (float)local_1b8._0_4_
              ;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[1] = (float)local_1b8._4_4_
              ;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[3] = 1.0;
              *(_func_int ***)
               local_318.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data = uStack_1b0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[0] =
                   (float)local_1a8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[1] =
                   (float)local_1a8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[0] =
                   (float)local_1a8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[1] =
                   (float)local_1a8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[0] =
                   (float)local_1b8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[1] =
                   (float)local_1b8._4_4_;
              goto LAB_01080706;
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != 4);
        lVar12 = local_38 + 1;
      } while (lVar12 != 4);
    }
  }
  iVar4 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar4);
  local_1b8 = (undefined1  [8])&DAT_3f0000003f000000;
  uStack_1b0 = (_func_int **)0x3f8000003f000000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_270,
             (long)local_318.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_318.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type *)local_1b8,
             (allocator_type *)local_2b8);
  local_1b8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_1b0,
             "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
             ,0x65);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar12 + 0x5e0))(0xbe2);
  (**(code **)(lVar12 + 0x100))(0x8006);
  (**(code **)(lVar12 + 0x120))(1,1);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&local_208,&local_318,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_270,4)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_name._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_270.m_name._M_dataplus._M_p,
                    local_270.m_name.field_2._M_allocated_capacity -
                    (long)local_270.m_name._M_dataplus._M_p);
  }
  local_1b8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_1b0,"Verifying result.",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  std::ios_base::~ios_base(local_140);
  iVar14 = 0;
  iVar4 = iVar14;
  if (0 < local_208.m_height) {
    iVar16 = 0;
    iVar4 = 0;
    do {
      uVar20 = (ulong)(uint)local_208.m_width;
      iVar21 = iVar14;
      if (0 < local_208.m_width) {
        do {
          uVar2 = *(uint *)((long)local_208.m_pixels.m_ptr + (long)iVar21 * 4);
          if (((local_27c < (int)((uVar2 & 0xff) - 0x7f)) ||
              (local_278 < (int)((uVar2 >> 8 & 0xff) - 0x7f))) ||
             (local_274 < (int)((uVar2 >> 0x10 & 0xff) - 0x7f))) {
            iVar4 = 1;
          }
          iVar21 = iVar21 + 1;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      iVar16 = iVar16 + 1;
      iVar14 = iVar14 + local_208.m_width;
    } while (iVar16 != local_208.m_height);
  }
  if (iVar4 == 0) {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"No overlapping fragments detected.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
  }
  else {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"Overlapping fragments detected, image is not valid.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
    pTVar3 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
    local_2b8 = (undefined1  [8])&local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Result of rendering","");
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Result of rendering","");
    tcu::LogImageSet::LogImageSet(&local_270,(string *)local_2b8,&local_2f8);
    tcu::TestLog::startImageSet
              (pTVar3,local_270.m_name._M_dataplus._M_p,local_270.m_description._M_dataplus._M_p);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Result","");
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Result","");
    pSVar13 = &local_208;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,&local_2d8,&local_228,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar3,__buf,(size_t)pSVar13);
    tcu::TestLog::endImageSet(pTVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_description._M_dataplus._M_p != &local_270.m_description.field_2) {
      operator_delete(local_270.m_description._M_dataplus._M_p,
                      local_270.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_name._M_dataplus._M_p != &local_270.m_name.field_2) {
      operator_delete(local_270.m_name._M_dataplus._M_p,
                      local_270.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != (undefined1  [8])&local_2a8) {
      operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
    }
    this->m_allIterationsPassed = false;
  }
  if (*(int *)&(this->super_BaseRenderingCase).field_0xc4 == 2) {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"Searching missing fragments.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
    if (0 < local_208.m_height) {
      iVar14 = 0;
      iVar16 = 0;
      bVar19 = false;
      do {
        uVar20 = (ulong)(uint)local_208.m_width;
        iVar21 = iVar14;
        if (0 < local_208.m_width) {
          do {
            uVar2 = *(uint *)((long)local_208.m_pixels.m_ptr + (long)iVar21 * 4);
            if ((((int)(uVar2 & 0xff) <= local_27c) || ((int)(uVar2 >> 8 & 0xff) <= local_278)) ||
               ((int)(uVar2 >> 0x10 & 0xff) <= local_274)) {
              bVar19 = true;
            }
            iVar21 = iVar21 + 1;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        iVar16 = iVar16 + 1;
        iVar14 = iVar14 + local_208.m_width;
      } while (iVar16 != local_208.m_height);
      if (bVar19) {
        local_1b8 = (undefined1  [8])
                    ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_1b0,"Missing fragments detected, image is not valid.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
        std::ios_base::~ios_base(local_140);
        if (iVar4 == 0) {
          pTVar3 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
          local_2b8 = (undefined1  [8])&local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b8,"Result of rendering","");
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f8,"Result of rendering","");
          tcu::LogImageSet::LogImageSet(&local_270,(string *)local_2b8,&local_2f8);
          tcu::TestLog::startImageSet
                    (pTVar3,local_270.m_name._M_dataplus._M_p,
                     local_270.m_description._M_dataplus._M_p);
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Result","");
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Result","");
          pSVar13 = &local_208;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b8,&local_2d8,&local_228,pSVar13,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar3,__buf_00,(size_t)pSVar13);
          tcu::TestLog::endImageSet(pTVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != local_188) {
            operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
          }
          if (local_1b8 != (undefined1  [8])local_1a8) {
            operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270.m_description._M_dataplus._M_p != &local_270.m_description.field_2) {
            operator_delete(local_270.m_description._M_dataplus._M_p,
                            local_270.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270.m_name._M_dataplus._M_p != &local_270.m_name.field_2) {
            operator_delete(local_270.m_name._M_dataplus._M_p,
                            local_270.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if (local_2b8 != (undefined1  [8])&local_2a8) {
            operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
          }
        }
        this->m_allIterationsPassed = false;
        goto LAB_0108148e;
      }
    }
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"No missing fragments detected.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
  }
LAB_0108148e:
  iVar4 = this->m_iteration + 1;
  this->m_iteration = iVar4;
  IVar17 = CONTINUE;
  if (iVar4 == this->m_iterationCount) {
    description = "Found invalid pixels";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar17 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_208);
  tcu::TestLog::endSection(local_1c8.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return IVar17;
}

Assistant:

FillRuleCase::IterateResult FillRuleCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const int								thresholdRed			= 1 << (8 - getPixelFormat().redBits);
	const int								thresholdGreen			= 1 << (8 - getPixelFormat().greenBits);
	const int								thresholdBlue			= 1 << (8 - getPixelFormat().blueBits);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	bool									imageShown				= false;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		gl.enable(GL_BLEND);
		gl.blendEquation(GL_FUNC_ADD);
		gl.blendFunc(GL_ONE, GL_ONE);
		drawPrimitives(resultImage, drawBuffer, colorBuffer, GL_TRIANGLES);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_testCtx.getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
								<< tcu::TestLog::Image("Result", "Result", resultImage)
								<< tcu::TestLog::EndImageSet;

			imageShown = true;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_testCtx.getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			if (!imageShown)
			{
				m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
									<< tcu::TestLog::Image("Result", "Result", resultImage)
									<< tcu::TestLog::EndImageSet;
			}

			m_allIterationsPassed = false;
		}
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixels");

		return STOP;
	}
	else
		return CONTINUE;
}